

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToArrayLengthFree(JSContext *ctx,uint32_t *plen,JSValue val,BOOL is_array_ctor)

{
  int iVar1;
  JSToNumberHintEnum flag;
  JSToNumberHintEnum flag_00;
  JSValueUnion JVar2;
  int unaff_EBP;
  int v;
  double d;
  double dVar3;
  JSValue JVar4;
  uint32_t len;
  uint32_t len1;
  uint32_t local_3c;
  JSValueUnion local_38;
  uint32_t local_2c;
  
  flag = (JSToNumberHintEnum)val.tag;
  JVar2 = val.u;
  if (flag < 3) {
    if ((int)val.u._0_4_ < 0) {
      iVar1 = 3;
    }
    else {
      iVar1 = 0;
      local_3c = val.u._0_4_;
    }
    if (iVar1 != 0) {
      if (iVar1 != 3) {
        return unaff_EBP;
      }
LAB_001219b8:
      JS_ThrowRangeError(ctx,"invalid array length");
      return -1;
    }
  }
  else if (flag == 7) {
    local_3c = (uint32_t)(long)JVar2.float64;
    dVar3 = (double)((long)JVar2.float64 & 0xffffffff);
    if ((dVar3 != JVar2.float64) || (NAN(dVar3) || NAN(JVar2.float64))) goto LAB_001219b8;
  }
  else if (is_array_ctor == 0) {
    if (0xfffffff4 < flag) {
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
    }
    local_38 = JVar2;
    flag_00 = flag;
    iVar1 = JS_ToInt32Free(ctx,(int32_t *)&local_3c,val);
    if (iVar1 != 0) {
      if (flag < 0xfffffff5) {
        return -1;
      }
      iVar1 = *JVar2.ptr;
      *(int *)JVar2.ptr = iVar1 + -1;
      if (1 < iVar1) {
        return -1;
      }
      local_38 = JVar2;
      __JS_FreeValueRT(ctx->rt,val);
      return -1;
    }
    JVar4 = JS_ToNumberHintFree(ctx,val,flag_00);
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    iVar1 = JS_ToArrayLengthFree(ctx,&local_2c,JVar4,0);
    if (iVar1 != 0) {
      return -1;
    }
    if (local_2c != local_3c) goto LAB_001219b8;
  }
  else {
    JVar4 = JS_ToNumberHintFree(ctx,val,flag);
    if ((int)JVar4.tag == 6) {
      return -1;
    }
    iVar1 = JS_ToArrayLengthFree(ctx,&local_3c,JVar4,1);
    if (iVar1 != 0) {
      return -1;
    }
  }
  *plen = local_3c;
  return 0;
}

Assistant:

static __exception int JS_ToArrayLengthFree(JSContext *ctx, uint32_t *plen,
                                            JSValue val, BOOL is_array_ctor)
{
    uint32_t tag, len;

    tag = JS_VALUE_GET_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
        {
            int v;
            v = JS_VALUE_GET_INT(val);
            if (v < 0)
                goto fail;
            len = v;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_t a;
            BOOL res;
            bf_get_int32((int32_t *)&len, &p->num, BF_GET_INT_MOD);
            bf_init(ctx->bf_ctx, &a);
            bf_set_ui(&a, len);
            res = bf_cmp_eq(&a, &p->num);
            bf_delete(&a);
            JS_FreeValue(ctx, val);
            if (!res)
                goto fail;
        }
        break;
#endif
    default:
        if (JS_TAG_IS_FLOAT64(tag)) {
            double d;
            d = JS_VALUE_GET_FLOAT64(val);
            len = (uint32_t)d;
            if (len != d)
                goto fail;
        } else {
            uint32_t len1;

            if (is_array_ctor) {
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len, val, TRUE))
                    return -1;
            } else {
                /* legacy behavior: must do the conversion twice and compare */
                if (JS_ToUint32(ctx, &len, val)) {
                    JS_FreeValue(ctx, val);
                    return -1;
                }
                val = JS_ToNumberFree(ctx, val);
                if (JS_IsException(val))
                    return -1;
                /* cannot recurse because val is a number */
                if (JS_ToArrayLengthFree(ctx, &len1, val, FALSE))
                    return -1;
                if (len1 != len) {
                fail:
                    JS_ThrowRangeError(ctx, "invalid array length");
                    return -1;
                }
            }
        }
        break;
    }
    *plen = len;
    return 0;
}